

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_tga.c
# Opt level: O1

void free_tga(oTga *tga)

{
  if (tga != (oTga *)0x0) {
    if (tga->ident != (char *)0x0) {
      gdFree(tga->ident);
      tga->ident = (char *)0x0;
    }
    if (tga->bitmap != (int *)0x0) {
      gdFree(tga->bitmap);
      tga->bitmap = (int *)0x0;
    }
    gdFree(tga);
    return;
  }
  return;
}

Assistant:

void free_tga(oTga * tga)
{
	if (tga) {
		if (tga->ident) {
			gdFree(tga->ident);
			tga->ident = NULL;
		}
		if (tga->bitmap) {
			gdFree(tga->bitmap);
			tga->bitmap = NULL;
		}
		gdFree(tga);
		tga = NULL;
	}
}